

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSONAttachments(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  element_type *key;
  bool bVar1;
  element_type *peVar2;
  iterator iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  string *d;
  string *d_00;
  allocator<char> local_259;
  anon_class_1_0_00000001 local_258 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  JSON j_details;
  shared_ptr<QPDFFileSpecObjectHelper> fsoh;
  string local_228;
  JSON j_stream;
  JSON j_names;
  string local_1e8;
  QPDFEFStreamObjectHelper efs;
  string local_190;
  JSON j_streams;
  JSON j_attachments;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_120;
  JSON local_110;
  JSON local_100;
  JSON local_f0;
  JSON local_e0;
  JSON local_d0;
  JSON local_c0;
  JSON local_b0;
  JSON local_a0;
  JSON local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  local_80;
  QPDFEmbeddedFileDocumentHelper efdh;
  
  JSON::makeDictionary();
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&efdh,pdf);
  QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
              *)&local_80,&efdh);
  for (p_Var5 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &local_80._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    std::__shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&fsoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)(p_Var5 + 2));
    JSON::makeDictionary();
    JSON::addDictionaryMember(&j_details,(string *)&j_attachments,(JSON *)(p_Var5 + 1));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &efs.super_QPDFObjectHelper.super_BaseHandle);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efs,"filespec",(allocator<char> *)&j_names);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_190,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &((fsoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_QPDFObjectHelper).super_BaseHandle);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_228,(QPDFObjectHandle *)&local_190);
    JSON::makeString(&local_1e8);
    JSON::addDictionaryMember(&local_90,(string *)&j_details,(JSON *)&efs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8._M_string_length);
    std::__cxx11::string::~string((string *)&local_228);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_190._M_string_length);
    std::__cxx11::string::~string((string *)&efs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efs,"preferredname",(allocator<char> *)&local_190);
    QPDFFileSpecObjectHelper::getFilename_abi_cxx11_
              (&local_228,
               fsoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    JSON::makeString(&local_1e8);
    JSON::addDictionaryMember(&local_a0,(string *)&j_details,(JSON *)&efs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8._M_string_length);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&efs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efs,"preferredcontents",(allocator<char> *)&j_streams);
    key = fsoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"",(allocator<char> *)&local_130);
    QPDFFileSpecObjectHelper::getEmbeddedFileStream
              ((QPDFFileSpecObjectHelper *)&j_names,(string *)key);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_228,(QPDFObjectHandle *)&j_names);
    JSON::makeString(&local_190);
    JSON::addDictionaryMember(&local_b0,(string *)&j_details,(JSON *)&efs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_190._M_string_length);
    std::__cxx11::string::~string((string *)&local_228);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_names.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&efs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efs,"description",(allocator<char> *)&local_190);
    QPDFFileSpecObjectHelper::getDescription_abi_cxx11_
              (&local_228,
               fsoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    doJSONAttachments::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&local_1e8,&local_228);
    JSON::addDictionaryMember(&local_c0,(string *)&j_details,(JSON *)&efs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8._M_string_length);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&efs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efs,"names",(allocator<char> *)&local_1e8);
    JSON::makeDictionary();
    JSON::addDictionaryMember(&j_names,(string *)&j_details,(JSON *)&efs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
    std::__cxx11::string::~string((string *)&efs);
    QPDFFileSpecObjectHelper::getFilenames_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&efs,fsoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    for (peVar2 = efs.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar2 != (element_type *)&efs.super_QPDFObjectHelper.super_BaseHandle;
        peVar2 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)peVar2)) {
      JSON::makeString(&local_228);
      JSON::addDictionaryMember
                (&local_d0,(string *)&j_names,
                 (JSON *)((long)&(peVar2->value).
                                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         + 0x20));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&efs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efs,"streams",(allocator<char> *)&local_1e8);
    JSON::makeDictionary();
    JSON::addDictionaryMember(&j_streams,(string *)&j_details,(JSON *)&efs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
    std::__cxx11::string::~string((string *)&efs);
    QPDFFileSpecObjectHelper::getEmbeddedFileStreams((QPDFFileSpecObjectHelper *)&efs);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_130,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&efs);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &efs.super_QPDFObjectHelper.super_BaseHandle);
    iVar3 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_130);
    iVar4 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_130);
    for (; iVar3._M_node != iVar4._M_node;
        iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node)) {
      bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar3._M_node + 2));
      if (!bVar1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_120,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar3._M_node + 2));
        QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper(&efs,(QPDFObjectHandle *)&local_120);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
        JSON::makeDictionary();
        JSON::addDictionaryMember(&j_stream,(string *)&j_streams,(JSON *)(iVar3._M_node + 1));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"creationdate",&local_259);
        QPDFEFStreamObjectHelper::getCreationDate_abi_cxx11_(&local_190,&efs);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  (&local_1e8,(anon_class_1_0_00000001 *)&local_190,d);
        doJSONAttachments::anon_class_1_0_00000001::operator()(local_258,&local_1e8);
        JSON::addDictionaryMember(&local_e0,(string *)&j_stream,(JSON *)&local_228);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"modificationdate",&local_259);
        QPDFEFStreamObjectHelper::getCreationDate_abi_cxx11_(&local_190,&efs);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  (&local_1e8,(anon_class_1_0_00000001 *)&local_190,d_00);
        doJSONAttachments::anon_class_1_0_00000001::operator()(local_258,&local_1e8);
        JSON::addDictionaryMember(&local_f0,(string *)&j_stream,(JSON *)&local_228);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"mimetype",(allocator<char> *)local_258);
        QPDFEFStreamObjectHelper::getSubtype_abi_cxx11_(&local_1e8,&efs);
        doJSONAttachments::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_190,&local_1e8);
        JSON::addDictionaryMember(&local_100,(string *)&j_stream,(JSON *)&local_228);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_190._M_string_length);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"checksum",&local_259);
        QPDFEFStreamObjectHelper::getChecksum_abi_cxx11_(&local_190,&efs);
        QUtil::hex_encode(&local_1e8,&local_190);
        doJSONAttachments::anon_class_1_0_00000001::operator()(local_258,&local_1e8);
        JSON::addDictionaryMember(&local_110,(string *)&j_stream,(JSON *)&local_228);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_228);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_stream.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper(&efs);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_streams.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_names.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_details.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fsoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  ::~_Rb_tree(&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&efs,"attachments",(allocator<char> *)&local_80);
  JSON::writeDictionaryItem(p,first,(string *)&efs,&j_attachments,1);
  std::__cxx11::string::~string((string *)&efs);
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&efdh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&j_attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFJob::doJSONAttachments(Pipeline* p, bool& first, QPDF& pdf)
{
    auto to_iso8601 = [](std::string const& d) {
        // Convert PDF date to iso8601 if not empty; if empty, return
        // empty.
        std::string iso8601;
        QUtil::pdf_time_to_iso8601(d, iso8601);
        return iso8601;
    };

    auto null_or_string = [](std::string const& s) {
        if (s.empty()) {
            return JSON::makeNull();
        } else {
            return JSON::makeString(s);
        }
    };

    JSON j_attachments = JSON::makeDictionary();
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    for (auto const& iter: efdh.getEmbeddedFiles()) {
        std::string const& key = iter.first;
        auto fsoh = iter.second;
        auto j_details = j_attachments.addDictionaryMember(key, JSON::makeDictionary());
        j_details.addDictionaryMember(
            "filespec", JSON::makeString(fsoh->getObjectHandle().unparse()));
        j_details.addDictionaryMember("preferredname", JSON::makeString(fsoh->getFilename()));
        j_details.addDictionaryMember(
            "preferredcontents", JSON::makeString(fsoh->getEmbeddedFileStream().unparse()));
        j_details.addDictionaryMember("description", null_or_string(fsoh->getDescription()));
        auto j_names = j_details.addDictionaryMember("names", JSON::makeDictionary());
        for (auto const& i2: fsoh->getFilenames()) {
            j_names.addDictionaryMember(i2.first, JSON::makeString(i2.second));
        }
        auto j_streams = j_details.addDictionaryMember("streams", JSON::makeDictionary());
        for (auto const& [key2, value2]: fsoh->getEmbeddedFileStreams().as_dictionary()) {
            if (value2.null()) {
                continue;
            }
            auto efs = QPDFEFStreamObjectHelper(value2);
            auto j_stream = j_streams.addDictionaryMember(key2, JSON::makeDictionary());
            j_stream.addDictionaryMember(
                "creationdate", null_or_string(to_iso8601(efs.getCreationDate())));
            j_stream.addDictionaryMember(
                "modificationdate", null_or_string(to_iso8601(efs.getCreationDate())));
            j_stream.addDictionaryMember("mimetype", null_or_string(efs.getSubtype()));
            j_stream.addDictionaryMember(
                "checksum", null_or_string(QUtil::hex_encode(efs.getChecksum())));
        }
    }
    JSON::writeDictionaryItem(p, first, "attachments", j_attachments, 1);
}